

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

void sendError(UA_SecureChannel *channel,UA_ByteString *msg,size_t offset,UA_DataType *responseType,
              UA_UInt32 requestId,UA_StatusCode error)

{
  long lVar1;
  undefined1 p [8];
  UA_ResponseHeader *content;
  undefined4 requestId_00;
  UA_ByteString *channel_00;
  UA_DateTime UVar2;
  UA_ResponseHeader *pUStack_c0;
  undefined1 local_b8 [8];
  UA_ResponseHeader *responseHeader;
  void *response;
  undefined1 local_a0 [4];
  UA_StatusCode retval;
  UA_RequestHeader requestHeader;
  UA_StatusCode error_local;
  UA_UInt32 requestId_local;
  UA_DataType *responseType_local;
  size_t offset_local;
  UA_ByteString *msg_local;
  UA_SecureChannel *channel_local;
  
  pUStack_c0 = (UA_ResponseHeader *)0x142747;
  requestHeader.additionalHeader.content._32_4_ = error;
  requestHeader.additionalHeader.content._36_4_ = requestId;
  responseType_local = (UA_DataType *)offset;
  offset_local = (size_t)msg;
  msg_local = (UA_ByteString *)channel;
  response._4_4_ =
       UA_RequestHeader_decodeBinary(msg,(size_t *)&responseType_local,(UA_RequestHeader *)local_a0)
  ;
  if (response._4_4_ == 0) {
    lVar1 = -(ulong)(responseType->memSize + 0xf & 0xfffffff0);
    responseHeader = (UA_ResponseHeader *)(local_b8 + lVar1);
    *(undefined8 *)((long)&pUStack_c0 + lVar1) = 0x14278b;
    UA_init((UA_ResponseHeader *)(local_b8 + lVar1),responseType);
    local_b8 = (undefined1  [8])responseHeader;
    responseHeader->requestHandle = (UA_UInt32)requestHeader.timestamp;
    *(undefined8 *)((long)&pUStack_c0 + lVar1) = 0x1427ab;
    UVar2 = UA_DateTime_now();
    *(UA_DateTime *)local_b8 = UVar2;
    content = responseHeader;
    *(undefined4 *)((long)local_b8 + 0xc) = requestHeader.additionalHeader.content._32_4_;
    channel_00 = msg_local;
    requestId_00 = requestHeader.additionalHeader.content._36_4_;
    *(undefined8 *)((long)&pUStack_c0 + lVar1) = 0x1427dc;
    UA_SecureChannel_sendBinaryMessage
              ((UA_SecureChannel *)channel_00,requestId_00,content,responseType);
    *(undefined8 *)((long)&pUStack_c0 + lVar1) = 0x1427e8;
    UA_RequestHeader_deleteMembers((UA_RequestHeader *)local_a0);
    p = local_b8;
    *(undefined8 *)((long)&pUStack_c0 + lVar1) = 0x1427f4;
    UA_ResponseHeader_deleteMembers((UA_ResponseHeader *)p);
  }
  return;
}

Assistant:

static void
sendError(UA_SecureChannel *channel, const UA_ByteString *msg,
          size_t offset, const UA_DataType *responseType,
          UA_UInt32 requestId, UA_StatusCode error) {
    UA_RequestHeader requestHeader;
    UA_StatusCode retval = UA_RequestHeader_decodeBinary(msg, &offset, &requestHeader);
    if(retval != UA_STATUSCODE_GOOD)
        return;
    void *response = UA_alloca(responseType->memSize);
    UA_init(response, responseType);
    UA_ResponseHeader *responseHeader = (UA_ResponseHeader*)response;
    responseHeader->requestHandle = requestHeader.requestHandle;
    responseHeader->timestamp = UA_DateTime_now();
    responseHeader->serviceResult = error;
    UA_SecureChannel_sendBinaryMessage(channel, requestId, response, responseType);
    UA_RequestHeader_deleteMembers(&requestHeader);
    UA_ResponseHeader_deleteMembers(responseHeader);
}